

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O0

void __thiscall Assimp::Vertex::SortBack(Vertex *this,aiMesh *out,uint idx)

{
  float fVar1;
  bool bVar2;
  aiVector3D *paVar3;
  aiColor4D *paVar4;
  aiVector3D *paVar5;
  aiColor4D *paVar6;
  uint local_24;
  uint local_20;
  uint i_1;
  uint i;
  uint idx_local;
  aiMesh *out_local;
  Vertex *this_local;
  
  if (out->mNumVertices <= idx) {
    __assert_fail("idx<out->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/Vertex.h"
                  ,0xb5,"void Assimp::Vertex::SortBack(aiMesh *, unsigned int) const");
  }
  paVar3 = out->mVertices + idx;
  fVar1 = (this->position).y;
  paVar3->x = (this->position).x;
  paVar3->y = fVar1;
  paVar3->z = (this->position).z;
  bVar2 = aiMesh::HasNormals(out);
  if (bVar2) {
    paVar3 = out->mNormals + idx;
    fVar1 = (this->normal).y;
    paVar3->x = (this->normal).x;
    paVar3->y = fVar1;
    paVar3->z = (this->normal).z;
  }
  bVar2 = aiMesh::HasTangentsAndBitangents(out);
  if (bVar2) {
    paVar3 = out->mTangents + idx;
    fVar1 = (this->tangent).y;
    paVar3->x = (this->tangent).x;
    paVar3->y = fVar1;
    paVar3->z = (this->tangent).z;
    paVar3 = out->mBitangents + idx;
    fVar1 = (this->bitangent).y;
    paVar3->x = (this->bitangent).x;
    paVar3->y = fVar1;
    paVar3->z = (this->bitangent).z;
  }
  local_20 = 0;
  while (bVar2 = aiMesh::HasTextureCoords(out,local_20), bVar2) {
    paVar5 = this->texcoords + local_20;
    paVar3 = out->mTextureCoords[local_20] + idx;
    fVar1 = paVar5->y;
    paVar3->x = paVar5->x;
    paVar3->y = fVar1;
    paVar3->z = paVar5->z;
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  while (bVar2 = aiMesh::HasVertexColors(out,local_24), bVar2) {
    paVar6 = this->colors + local_24;
    paVar4 = out->mColors[local_24] + idx;
    fVar1 = paVar6->g;
    paVar4->r = paVar6->r;
    paVar4->g = fVar1;
    fVar1 = paVar6->a;
    paVar4->b = paVar6->b;
    paVar4->a = fVar1;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void SortBack(aiMesh* out, unsigned int idx) const {
        ai_assert(idx<out->mNumVertices);
        out->mVertices[idx] = position;

        if (out->HasNormals()) {
            out->mNormals[idx] = normal;
        }

        if (out->HasTangentsAndBitangents()) {
            out->mTangents[idx] = tangent;
            out->mBitangents[idx] = bitangent;
        }

        for(unsigned int i = 0; out->HasTextureCoords(i); ++i) {
            out->mTextureCoords[i][idx] = texcoords[i];
        }

        for(unsigned int i = 0; out->HasVertexColors(i); ++i) {
            out->mColors[i][idx] = colors[i];
        }
    }